

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::~PosixRandomAccessFile(PosixRandomAccessFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  if (this->has_permanent_fd_ == true) {
    close(this->fd_);
    LOCK();
    (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i =
         (this->fd_limiter_->acquires_allowed_).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pcVar2 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

~PosixRandomAccessFile() override {
    if (has_permanent_fd_) {
      assert(fd_ != -1);
      ::close(fd_);
      fd_limiter_->Release();
    }
  }